

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaConfig.cpp
# Opt level: O3

ssize_t __thiscall xmrig::CudaConfig::read(CudaConfig *this,int __fd,void *__buf,size_t __nbytes)

{
  ushort uVar1;
  bool bVar2;
  EVP_PKEY_CTX *pEVar3;
  char *devicesHint;
  ssize_t extraout_RAX;
  size_t __nbytes_00;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *extraout_RDX;
  undefined4 in_register_00000034;
  Value *obj;
  EVP_PKEY_CTX *dst;
  
  obj = (Value *)CONCAT44(in_register_00000034,__fd);
  uVar1 = (obj->data_).f.flags;
  if (uVar1 == 3) {
    bVar2 = Json::getBool(obj,"enabled",this->m_enabled);
    this->m_enabled = bVar2;
    pEVar3 = (EVP_PKEY_CTX *)Json::getString(obj,"loader",(char *)0x0);
    String::copy(&this->m_loader,pEVar3,src);
    devicesHint = Json::getString(obj,"devices-hint",(char *)0x0);
    setDevicesHint(this,devicesHint);
    pEVar3 = (EVP_PKEY_CTX *)Json::getValue(obj,"nvml");
    uVar1 = *(ushort *)(pEVar3 + 0xe);
    __nbytes_00 = (size_t)uVar1;
    if ((uVar1 >> 10 & 1) == 0) {
      pEVar3 = src_00;
      if ((uVar1 & 8) != 0) {
        this->m_nvml = uVar1 == 10;
      }
    }
    else {
      dst = (EVP_PKEY_CTX *)(*(ulong *)(pEVar3 + 8) & 0xffffffffffff);
      if ((uVar1 >> 0xc & 1) != 0) {
        dst = pEVar3;
      }
      String::copy(&this->m_nvmlLoader,dst,src_00);
      pEVar3 = extraout_RDX;
    }
    Threads<xmrig::CudaThreads>::read(&this->m_threads,__fd,pEVar3,__nbytes_00);
  }
  else if ((uVar1 & 8) == 0) {
    this->m_shouldSave = true;
  }
  else {
    this->m_enabled = uVar1 == 10;
  }
  generate(this);
  return extraout_RAX;
}

Assistant:

void xmrig::CudaConfig::read(const rapidjson::Value &value)
{
    if (value.IsObject()) {
        m_enabled   = Json::getBool(value, kEnabled, m_enabled);
        m_loader    = Json::getString(value, kLoader);

        setDevicesHint(Json::getString(value, kDevicesHint));

#       ifdef XMRIG_FEATURE_NVML
        auto &nvml = Json::getValue(value, kNvml);
        if (nvml.IsString()) {
            m_nvmlLoader = nvml.GetString();
        }
        else if (nvml.IsBool()) {
            m_nvml = nvml.GetBool();
        }
#       endif

        m_threads.read(value);

        generate();
    }
    else if (value.IsBool()) {
        m_enabled = value.GetBool();

        generate();
    }
    else {
        m_shouldSave = true;

        generate();
    }
}